

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O3

void __thiscall
iqxmlrpc::Server::schedule_response
          (Server *this,Response *resp,Server_connection *conn,Executor *exec)

{
  Packet *this_00;
  Response_header *this_01;
  string resp_str;
  string local_70;
  string local_50;
  
  dump_response_abi_cxx11_(&local_50,(iqxmlrpc *)resp,(Response *)conn);
  this_00 = (Packet *)operator_new(0x38);
  this_01 = (Response_header *)operator_new(0xb0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"OK","");
  http::Response_header::Response_header(this_01,200,&local_70);
  http::Packet::Packet(this_00,(Header *)this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  Server_connection::schedule_response(conn,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (exec != (Executor *)0x0) {
    (*exec->_vptr_Executor[1])(exec);
  }
  return;
}

Assistant:

void Server::schedule_response(
  const Response& resp, Server_connection* conn, Executor* exec )
{
  std::auto_ptr<Executor> executor_to_delete(exec);
  std::string resp_str = dump_response(resp);
  http::Packet *packet = new http::Packet(new http::Response_header(), resp_str);
  conn->schedule_response( packet );
}